

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

ostream * node::operator<<(ostream *os,BlockfileType *type)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*type == ASSUMED) {
    pcVar2 = "assumed";
  }
  else {
    if (*type != NORMAL) {
      std::ios::setstate((int)*(undefined8 *)(*(long *)os + -0x18) + (int)os);
      goto LAB_001e47bf;
    }
    pcVar2 = "normal";
  }
  std::operator<<(os,pcVar2);
LAB_001e47bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BlockfileType& type) {
    switch(type) {
        case BlockfileType::NORMAL: os << "normal"; break;
        case BlockfileType::ASSUMED: os << "assumed"; break;
        default: os.setstate(std::ios_base::failbit);
    }
    return os;
}